

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

bool __thiscall
HEkk::reinvertOnNumericalTrouble
          (HEkk *this,string *method_name,double *numerical_trouble_measure,double alpha_from_col,
          double alpha_from_row,double numerical_trouble_tolerance)

{
  double *pdVar1;
  double *in_RDX;
  HSimplexNla *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  bool in_stack_00000017;
  double in_stack_00000018;
  double in_stack_00000020;
  double in_stack_00000028;
  double new_pivot_threshold;
  double current_pivot_threshold;
  HEkk *in_stack_00000040;
  bool reinvert;
  bool numerical_trouble;
  HighsInt update_count;
  double abs_alpha_diff;
  double min_abs_alpha;
  double abs_alpha_from_row;
  double abs_alpha_from_col;
  string *this_00;
  bool local_a9;
  double local_a8;
  double local_a0;
  HighsLogOptions *local_98;
  double local_90;
  string local_78 [34];
  bool local_56;
  undefined1 local_55;
  int local_54;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double *local_18;
  
  local_38 = ABS(in_XMM0_Qa);
  local_40 = ABS((double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
  local_30 = in_XMM2_Qa;
  local_18 = in_RDX;
  pdVar1 = std::min<double>(&local_38,&local_40);
  local_48 = *pdVar1;
  local_50 = ABS(local_38 - local_40);
  *local_18 = local_50 / local_48;
  local_54 = *(int *)(in_RDI + 0x2944);
  local_55 = local_30 < *local_18;
  local_a9 = (bool)local_55 && 0 < local_54;
  local_56 = local_a9;
  this_00 = local_78;
  std::__cxx11::string::string(this_00,(string *)in_RSI);
  debugReportReinvertOnNumericalTrouble
            (in_stack_00000040,(string *)current_pivot_threshold,new_pivot_threshold,
             in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000017);
  std::__cxx11::string::~string(local_78);
  if ((local_56 & 1U) != 0) {
    local_90 = *(double *)(in_RDI + 0x2830);
    local_98 = (HighsLogOptions *)0x0;
    if (0.1 <= local_90) {
      if ((local_90 < 0.5) && (local_54 < 10)) {
        local_a8 = local_90 * 5.0;
        pdVar1 = std::min<double>(&local_a8,(double *)&kMaxPivotThreshold);
        local_98 = (HighsLogOptions *)*pdVar1;
      }
    }
    else {
      local_a0 = local_90 * 5.0;
      pdVar1 = std::min<double>(&local_a0,(double *)&kDefaultPivotThreshold);
      local_98 = (HighsLogOptions *)*pdVar1;
    }
    if (((double)local_98 != 0.0) || (NAN((double)local_98))) {
      highsLogUser(local_98,(HighsLogType)(*(long *)(in_RDI + 8) + 0x380),(char *)0x4,
                   "   Increasing Markowitz threshold to %g\n");
      *(HighsLogOptions **)(in_RDI + 0x2830) = local_98;
      HSimplexNla::setPivotThreshold(in_RSI,(double)this_00);
    }
  }
  return (bool)(local_56 & 1);
}

Assistant:

bool HEkk::reinvertOnNumericalTrouble(
    const std::string method_name, double& numerical_trouble_measure,
    const double alpha_from_col, const double alpha_from_row,
    const double numerical_trouble_tolerance) {
  double abs_alpha_from_col = fabs(alpha_from_col);
  double abs_alpha_from_row = fabs(alpha_from_row);
  double min_abs_alpha = min(abs_alpha_from_col, abs_alpha_from_row);
  double abs_alpha_diff = fabs(abs_alpha_from_col - abs_alpha_from_row);
  numerical_trouble_measure = abs_alpha_diff / min_abs_alpha;
  const HighsInt update_count = info_.update_count;
  // Reinvert if the relative difference is large enough, and updates have been
  // performed
  const bool numerical_trouble =
      numerical_trouble_measure > numerical_trouble_tolerance;
  const bool reinvert = numerical_trouble && update_count > 0;
  debugReportReinvertOnNumericalTrouble(method_name, numerical_trouble_measure,
                                        alpha_from_col, alpha_from_row,
                                        numerical_trouble_tolerance, reinvert);
  if (reinvert) {
    // Consider increasing the Markowitz multiplier
    const double current_pivot_threshold = info_.factor_pivot_threshold;
    double new_pivot_threshold = 0;
    if (current_pivot_threshold < kDefaultPivotThreshold) {
      // Threshold is below default value, so increase it
      new_pivot_threshold =
          min(current_pivot_threshold * kPivotThresholdChangeFactor,
              kDefaultPivotThreshold);
    } else if (current_pivot_threshold < kMaxPivotThreshold) {
      // Threshold is below max value, so increase it if few updates have been
      // performed
      if (update_count < 10)
        new_pivot_threshold =
            min(current_pivot_threshold * kPivotThresholdChangeFactor,
                kMaxPivotThreshold);
    }
    if (new_pivot_threshold) {
      highsLogUser(options_->log_options, HighsLogType::kWarning,
                   "   Increasing Markowitz threshold to %g\n",
                   new_pivot_threshold);
      info_.factor_pivot_threshold = new_pivot_threshold;
      simplex_nla_.setPivotThreshold(new_pivot_threshold);
    }
  }
  return reinvert;
}